

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O1

JL_STATUS JlCreateBoolObject(_Bool BoolValue,JlDataObject **pBoolObject)

{
  JL_STATUS JVar1;
  JlDataObject *boolObject;
  JlDataObject *local_20;
  
  local_20 = (JlDataObject *)0x0;
  if (pBoolObject == (JlDataObject **)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pBoolObject = (JlDataObject *)0x0;
    JVar1 = JlCreateObject(JL_DATA_TYPE_BOOL,&local_20);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlSetObjectBool(local_20,BoolValue);
      if (JVar1 == JL_STATUS_SUCCESS) {
        *pBoolObject = local_20;
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&local_20);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlCreateBoolObject
    (
        bool                BoolValue,          // [in]
        JlDataObject**      pBoolObject         // [out]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* boolObject = NULL;

    if( NULL != pBoolObject )
    {
        *pBoolObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_BOOL, &boolObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlSetObjectBool( boolObject, BoolValue );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pBoolObject = boolObject;
            }
            else
            {
                JlFreeObjectTree( &boolObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}